

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracteventdispatcher.cpp
# Opt level: O3

QList<QAbstractEventDispatcher::TimerInfo> * __thiscall
QAbstractEventDispatcherV2::registeredTimers
          (QList<QAbstractEventDispatcher::TimerInfo> *__return_storage_ptr__,
          QAbstractEventDispatcherV2 *this,QObject *object)

{
  long lVar1;
  int *piVar2;
  iterator iVar3;
  iterator iVar4;
  long lVar5;
  TimerInfoV2 *t;
  long in_FS_OFFSET;
  int local_60;
  TimerId local_5c;
  QList<QAbstractEventDispatcher::TimerInfoV2> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d._0_4_ = 0xaaaaaaaa;
  local_58.d.d._4_4_ = 0xaaaaaaaa;
  local_58.d.ptr._0_4_ = 0xaaaaaaaa;
  local_58.d.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(*(long *)this + 0xd0))(&local_58);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (TimerInfo *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QList<QAbstractEventDispatcher::TimerInfo>::reserve(__return_storage_ptr__,local_58.d.size);
  iVar3 = QList<QAbstractEventDispatcher::TimerInfoV2>::begin(&local_58);
  iVar4 = QList<QAbstractEventDispatcher::TimerInfoV2>::end(&local_58);
  if (iVar3.i != iVar4.i) {
    do {
      local_5c = (iVar3.i)->timerId;
      lVar1 = ((iVar3.i)->interval).__r;
      lVar5 = lVar1 / 1000000;
      lVar5 = (ulong)(lVar5 * 1000000 < lVar1) + lVar5;
      if (0x7ffffffe < lVar5) {
        lVar5 = 0x7fffffff;
      }
      if (lVar5 < -0x7fffffff) {
        lVar5 = -0x80000000;
      }
      local_60 = (int)lVar5;
      QtPrivate::QPodArrayOps<QAbstractEventDispatcher::TimerInfo>::
      emplace<int,int,Qt::TimerType_const&>
                ((QPodArrayOps<QAbstractEventDispatcher::TimerInfo> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(int *)&local_5c,&local_60,&(iVar3.i)->timerType);
      QList<QAbstractEventDispatcher::TimerInfo>::end(__return_storage_ptr__);
      iVar3.i = iVar3.i + 1;
    } while (iVar3.i != iVar4.i);
  }
  piVar2 = (int *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_58.d.d._4_4_,local_58.d.d._0_4_),0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

auto QAbstractEventDispatcherV2::registeredTimers(QObject *object) const -> QList<TimerInfo>
{
    auto self = static_cast<const QAbstractEventDispatcherV2 *>(this);
    QList<TimerInfoV2> timers = self->timersForObject(object);
    QList<TimerInfo> result;
    result.reserve(timers.size());
    for (const TimerInfoV2 &t : timers)
        result.emplaceBack(qToUnderlying(t.timerId), fromDuration<int>(t.interval), t.timerType);
    return result;
}